

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

anon_enum_32 prepareForBitwiseOperation(QBitArray *self,QBitArray *other)

{
  Data *pDVar1;
  Data *pDVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  anon_enum_32 aVar6;
  QTypedArrayData<char> *tmp;
  qsizetype qVar7;
  qsizetype qVar8;
  
  pDVar1 = (self->d).d.d;
  bVar5 = true;
  bVar4 = true;
  if (pDVar1 != (Data *)0x0) {
    bVar4 = 1 < (__int_type_conflict)
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>;
  }
  pDVar2 = (other->d).d.d;
  if (pDVar2 != (Data *)0x0) {
    bVar5 = 1 < (__int_type_conflict)
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>;
  }
  aVar6 = Endian;
  if (!(bool)(bVar4 & bVar5)) {
    if ((bool)(bVar4 | bVar5)) {
      if (bVar5) {
        return CLD_EXITED;
      }
    }
    else {
      if (pDVar1 == (Data *)0x0) {
        qVar7 = 0;
      }
      else {
        qVar7 = (pDVar1->super_QArrayData).alloc;
      }
      if (pDVar2 == (Data *)0x0) {
        qVar8 = 0;
      }
      else {
        qVar8 = (pDVar2->super_QArrayData).alloc;
      }
      if (qVar8 <= qVar7) {
        return CLD_EXITED;
      }
    }
    (self->d).d.d = pDVar2;
    (other->d).d.d = pDVar1;
    pcVar3 = (self->d).d.ptr;
    (self->d).d.ptr = (other->d).d.ptr;
    (other->d).d.ptr = pcVar3;
    qVar7 = (self->d).d.size;
    (self->d).d.size = (other->d).d.size;
    (other->d).d.size = qVar7;
    aVar6 = CLD_EXITED;
  }
  return aVar6;
}

Assistant:

bool needsDetach() const noexcept { return !d || d->needsDetach(); }